

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_dev.cpp
# Opt level: O1

bool ReadSuperCardPro(string *path,shared_ptr<Disk> *disk)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  SCPDevDisk *pSVar3;
  int iVar4;
  mapped_type *pmVar5;
  exception *this;
  shared_ptr<SCPDevDisk> scp_dev_disk;
  unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> supercardpro;
  int fw_version;
  int hw_version;
  SCPDevDisk *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  string local_80;
  _Head_base<0UL,_SuperCardPro_*,_false> local_60;
  int local_58;
  int local_54;
  key_type local_50;
  
  util::lowercase(&local_80,path);
  iVar4 = std::__cxx11::string::compare((char *)&local_80);
  paVar1 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (iVar4 == 0) {
    SuperCardPro::Open();
    if (local_60._M_head_impl == (SuperCardPro *)0x0) {
      this = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[36]>
                (this,(char (*) [36])"failed to open SuperCard Pro device");
      __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    local_54 = 0;
    local_58 = 0;
    SuperCardPro::GetInfo(local_60._M_head_impl,&local_54,&local_58);
    local_90 = (SCPDevDisk *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SCPDevDisk,std::allocator<SCPDevDisk>,std::unique_ptr<SuperCardPro,std::default_delete<SuperCardPro>>>
              (&local_88,&local_90,(allocator<SCPDevDisk> *)&local_80,
               (unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> *)&local_60);
    local_80._M_dataplus._M_p = (pointer)0x100000052;
    DemandDisk::extend(&local_90->super_DemandDisk,(CylHead *)&local_80);
    VersionString_abi_cxx11_(&local_80,local_54);
    pSVar3 = local_90;
    paVar2 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"hw_version","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(pSVar3->super_DemandDisk).super_Disk.metadata,&local_50);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    VersionString_abi_cxx11_(&local_80,local_58);
    pSVar3 = local_90;
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"fw_version","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(pSVar3->super_DemandDisk).super_Disk.metadata,&local_50);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_replace
              ((ulong)&(local_90->super_DemandDisk).super_Disk.strType,0,
               (char *)(local_90->super_DemandDisk).super_Disk.strType._M_string_length,0x1b363d);
    (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)local_90;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,&local_88);
    if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
    }
    if (local_60._M_head_impl != (SuperCardPro *)0x0) {
      (*(local_60._M_head_impl)->_vptr_SuperCardPro[1])();
    }
  }
  return iVar4 == 0;
}

Assistant:

bool ReadSuperCardPro(const std::string& path, std::shared_ptr<Disk>& disk)
{
    // ToDo: use path to select from multiple devices?
    if (util::lowercase(path) != "scp:")
        return false;

    auto supercardpro = SuperCardPro::Open();
    if (!supercardpro)
        throw util::exception("failed to open SuperCard Pro device");

    int hw_version = 0, fw_version = 0;
    supercardpro->GetInfo(hw_version, fw_version);

    auto scp_dev_disk = std::make_shared<SCPDevDisk>(std::move(supercardpro));
    scp_dev_disk->extend(CylHead(83 - 1, 2 - 1));

    scp_dev_disk->metadata["hw_version"] = VersionString(hw_version);
    scp_dev_disk->metadata["fw_version"] = VersionString(fw_version);

    scp_dev_disk->strType = "SuperCard Pro";
    disk = scp_dev_disk;

    return true;
}